

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabel::contextMenuEvent(QLabel *this,QContextMenuEvent *ev)

{
  int __fd;
  QLabelPrivate *this_00;
  QMenu *pQVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  QPoint *in_RSI;
  QMenu *in_RDI;
  QMenu *menu;
  QLabelPrivate *d;
  QWidget *in_stack_00000038;
  QPoint *in_stack_ffffffffffffffe0;
  QPoint *pQVar1;
  
  this_00 = d_func((QLabel *)0x5b0a6c);
  if ((*(ushort *)&this_00->field_0x340 >> 4 & 1) == 0) {
    QEvent::ignore((QEvent *)in_RSI);
  }
  else {
    pQVar1 = QContextMenuEvent::pos((QContextMenuEvent *)in_RSI);
    __fd = (int)pQVar1;
    pQVar2 = QLabelPrivate::createStandardContextMenu(this_00,in_stack_ffffffffffffffe0);
    if (pQVar2 == (QMenu *)0x0) {
      QEvent::ignore((QEvent *)in_RSI);
    }
    else {
      QEvent::accept((QEvent *)in_RSI,__fd,__addr,in_RCX);
      QWidget::setAttribute(in_stack_00000038,this._4_4_,this._3_1_);
      QContextMenuEvent::globalPos((QContextMenuEvent *)in_RSI);
      QMenu::popup(in_RDI,in_RSI,(QAction *)this_00);
    }
  }
  return;
}

Assistant:

void QLabel::contextMenuEvent(QContextMenuEvent *ev)
{
    Q_D(QLabel);
    if (!d->isTextLabel) {
        ev->ignore();
        return;
    }
    QMenu *menu = d->createStandardContextMenu(ev->pos());
    if (!menu) {
        ev->ignore();
        return;
    }
    ev->accept();
    menu->setAttribute(Qt::WA_DeleteOnClose);
    menu->popup(ev->globalPos());
}